

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JumpConditionalStatement.cpp
# Opt level: O1

void __thiscall
IRT::JumpConditionalStatement::JumpConditionalStatement
          (JumpConditionalStatement *this,LogicOperatorType type,Expression *left,Expression *right,
          Label *label_true,Label *label_false)

{
  pointer pcVar1;
  
  (this->super_Statement).super_BaseElement._vptr_BaseElement =
       (_func_int **)&PTR__JumpConditionalStatement_0016ed80;
  this->operator_type_ = type;
  (this->label_true_).label_._M_dataplus._M_p = (pointer)&(this->label_true_).label_.field_2;
  pcVar1 = (label_true->label_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->label_true_,pcVar1,pcVar1 + (label_true->label_)._M_string_length);
  (this->label_false_).label_._M_dataplus._M_p = (pointer)&(this->label_false_).label_.field_2;
  pcVar1 = (label_false->label_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->label_false_,pcVar1,pcVar1 + (label_false->label_)._M_string_length);
  this->left_operand_ = left;
  this->right_operand_ = right;
  return;
}

Assistant:

JumpConditionalStatement::JumpConditionalStatement(LogicOperatorType type,
                                                   Expression *left,
                                                   Expression *right,
                                                   Label label_true,
                                                   Label label_false)
    : operator_type_(type),
      left_operand_(left),
      right_operand_(right),
      label_true_(label_true),
      label_false_(label_false) {}